

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O3

void __thiscall NaControlLaw::~NaControlLaw(NaControlLaw *this)

{
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00173b20;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaControlLaw_00173ba0;
  if (this->dataio != (NaDataFile *)0x0) {
    (*this->dataio->_vptr_NaDataFile[1])();
  }
  if (this->filepath != (char *)0x0) {
    operator_delete__(this->filepath);
  }
  (this->lin_rand).super_NaUnit.super_NaLogging._vptr_NaLogging =
       (_func_int **)&PTR_PrintLog_001741d8;
  (this->lin_rand).super_NaConfigPart._vptr_NaConfigPart =
       (_func_int **)&PTR__NaLinearNoiseGen_00174258;
  NaConfigPart::~NaConfigPart(&(this->lin_rand).LinChain.super_NaConfigPart);
  NaUnit::~NaUnit(&(this->lin_rand).LinChain.super_NaUnit);
  (this->lin_rand).LinChain.super_NaDynAr<NaLinearUnit>._vptr_NaDynAr =
       (_func_int **)&PTR__NaDynAr_00173ca8;
  NaDynAr<NaLinearUnit>::clean(&(this->lin_rand).LinChain.super_NaDynAr<NaLinearUnit>);
  NaRandomSequence::~NaRandomSequence(&(this->lin_rand).RandSeq);
  NaConfigPart::~NaConfigPart(&(this->lin_rand).super_NaConfigPart);
  NaUnit::~NaUnit(&(this->lin_rand).super_NaUnit);
  (this->items)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00173d68;
  NaDynAr<NaControlLawItem>::clean(&this->items);
  NaConfigPart::~NaConfigPart(&this->super_NaConfigPart);
  NaUnit::~NaUnit(&this->super_NaUnit);
  return;
}

Assistant:

NaControlLaw::~NaControlLaw ()
{
    delete dataio;
    delete[] filepath;
}